

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

ON_XMLParameters * __thiscall ON_PostEffectParams::CImpl::AsXMLParameters(CImpl *this)

{
  ON_XMLParameters *this_00;
  
  if (this->_params == (ON_XMLParameters *)0x0) {
    this_00 = (ON_XMLParameters *)operator_new(0x10);
    ON_XMLParameters::ON_XMLParameters(this_00,&this->_node);
    this->_params = this_00;
  }
  return this->_params;
}

Assistant:

const ON_XMLParameters& AsXMLParameters(void) const
  {
    if (nullptr == _params)
    {
      _params = new ON_XMLParameters(_node);
    }

    return *_params;
  }